

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

ObjWriteGuardBucket
BackwardPass::MergeWriteGuards(ObjWriteGuardBucket bucket1,ObjWriteGuardBucket bucket2)

{
  code *pcVar1;
  bool bVar2;
  BVSparse<Memory::JitArenaAllocator> *this;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined4 *puVar3;
  BVSparse<Memory::JitArenaAllocator> *local_38;
  BVSparse<Memory::JitArenaAllocator> *mergedWriteGuards;
  BVSparse<Memory::JitArenaAllocator> *writeGuards2;
  BVSparse<Memory::JitArenaAllocator> *writeGuards1;
  ObjWriteGuardBucket bucket2_local;
  ObjWriteGuardBucket bucket1_local;
  ObjWriteGuardBucket bucket;
  
  writeGuards1 = bucket2.writeGuards;
  bucket2_local = bucket1;
  this = ObjWriteGuardBucket::GetWriteGuards(&bucket2_local);
  this_00 = ObjWriteGuardBucket::GetWriteGuards((ObjWriteGuardBucket *)&writeGuards1);
  if ((this == (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x4ec,"(writeGuards1 || writeGuards2)","writeGuards1 || writeGuards2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    local_38 = BVSparse<Memory::JitArenaAllocator>::CopyNew(this_00);
  }
  else {
    local_38 = BVSparse<Memory::JitArenaAllocator>::CopyNew(this);
    if (this_00 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Or(local_38,this_00);
    }
  }
  ObjWriteGuardBucket::ObjWriteGuardBucket(&bucket1_local);
  ObjWriteGuardBucket::SetWriteGuards(&bucket1_local,local_38);
  return (ObjWriteGuardBucket)bucket1_local.writeGuards;
}

Assistant:

ObjWriteGuardBucket
BackwardPass::MergeWriteGuards(ObjWriteGuardBucket bucket1, ObjWriteGuardBucket bucket2)
{
    BVSparse<JitArenaAllocator> *writeGuards1 = bucket1.GetWriteGuards();
    BVSparse<JitArenaAllocator> *writeGuards2 = bucket2.GetWriteGuards();
    Assert(writeGuards1 || writeGuards2);

    BVSparse<JitArenaAllocator> *mergedWriteGuards;
    if (writeGuards1)
    {
        mergedWriteGuards = writeGuards1->CopyNew();
        if (writeGuards2)
        {
            mergedWriteGuards->Or(writeGuards2);
        }
    }
    else
    {
        mergedWriteGuards = writeGuards2->CopyNew();
    }

    ObjWriteGuardBucket bucket;
    bucket.SetWriteGuards(mergedWriteGuards);
    return bucket;
}